

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall demo::Logging::LogLine::LogLine(LogLine *this)

{
  ostringstream *this_00;
  long in_FS_OFFSET;
  string context;
  string local_50 [8];
  long local_48;
  string local_30 [32];
  
  this->capture_ = *(Logging **)(in_FS_OFFSET + -0x10);
  this_00 = &this->output_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  Tracing::GetContext_abi_cxx11_();
  if (local_48 == 0) {
    std::operator<<((ostream *)this_00,"(unknown context): ");
  }
  else {
    std::__cxx11::string::string(local_30,local_50);
    std::operator<<((ostream *)this_00,local_30);
    std::operator<<((ostream *)this_00,": ");
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

Logging::LogLine::LogLine() : capture_(GetCurrent()) {
  const std::string context = Tracing::GetContext();
  if (!context.empty()) {
    *this << context << ": ";
  } else {
    *this << "(unknown context): ";
  }
}